

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::MultiPartInputFile::initialize(MultiPartInputFile *this)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  Header *src;
  bool bVar3;
  Data *pDVar4;
  string *psVar5;
  iterator iVar6;
  InputPartData *this_00;
  ArgExc *this_01;
  InputExc *pIVar7;
  undefined1 *type;
  pointer pHVar8;
  code *pcVar9;
  long lVar10;
  char *pcVar11;
  undefined *puVar12;
  pointer pHVar13;
  Data *this_02;
  ulong uVar14;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attrs;
  Header header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GenericInputFile::readMagicNumberAndVersionField
            (&this->super_GenericInputFile,(this->_data->super_InputStreamMutex).is,
             &this->_data->version);
  uVar2 = this->_data->version;
  if ((~uVar2 & 0x1200) == 0) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc((InputExc *)this_01,"Multipart files cannot have the tiled bit set")
    ;
    puVar12 = &Iex_2_5::InputExc::typeinfo;
    pcVar9 = Iex_2_5::InputExc::~InputExc;
  }
  else {
    do {
      local_e8._M_dataplus._M_p = (pointer)0x0;
      Header::Header(&header,0x40,0x40,1.0,(V2f *)&local_e8,1.0,INCREASING_Y,ZIP_COMPRESSION);
      Header::readFrom(&header,(this->_data->super_InputStreamMutex).is,&this->_data->version);
      bVar3 = Header::readsNothing(&header);
      if (bVar3) {
        Header::~Header(&header);
        break;
      }
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                (&this->_data->_headers,&header);
      Header::~Header(&header);
    } while ((uVar2 >> 0xc & 1) != 0);
    type = Imf_2_5::TILEDIMAGE_abi_cxx11_;
    if ((uVar2 >> 9 & 1) == 0) {
      type = Imf_2_5::SCANLINEIMAGE_abi_cxx11_;
    }
    lVar15 = 0;
    uVar14 = 0;
    while( true ) {
      pDVar4 = this->_data;
      pHVar13 = (pDVar4->_headers).
                super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
                super__Vector_impl_data._M_start;
      pHVar8 = (pDVar4->_headers).
               super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pHVar8 - (long)pHVar13) / 0x38) <= uVar14) {
        if ((uVar2 >> 0xc & 1) != 0) {
          p_Var1 = &header._map._M_t._M_impl.super__Rb_tree_header;
          header._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               header._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          header._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          lVar15 = 0;
          uVar14 = 0;
          header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          for (; uVar14 < (ulong)(((long)pHVar8 - (long)pHVar13) / 0x38); uVar14 = uVar14 + 1) {
            psVar5 = Header::name_abi_cxx11_
                               ((Header *)((long)&(pHVar13->_map)._M_t._M_impl + lVar15));
            iVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&header,psVar5);
            if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
              pIVar7 = (InputExc *)__cxa_allocate_exception(0x48);
              psVar5 = Header::name_abi_cxx11_
                                 ((Header *)
                                  ((long)&(((this->_data->_headers).
                                            super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                          _M_impl + lVar15));
              std::operator+(&local_70,"Header name ",psVar5);
              std::operator+(&local_e8,&local_70," is not a unique name.");
              Iex_2_5::InputExc::InputExc(pIVar7,(string *)&local_e8);
              __cxa_throw(pIVar7,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
            }
            psVar5 = Header::name_abi_cxx11_
                               ((Header *)
                                ((long)&(((this->_data->_headers).
                                          super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                        _M_impl + lVar15));
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&header,psVar5);
            pHVar13 = (this->_data->_headers).
                      super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pHVar8 = (this->_data->_headers).
                     super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar15 = lVar15 + 0x38;
          }
          this_02 = (Data *)&header;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_02);
          uVar14 = 1;
          lVar15 = 0x38;
          while( true ) {
            pDVar4 = this->_data;
            src = (pDVar4->_headers).
                  super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
                  super__Vector_impl_data._M_start;
            if ((ulong)(((long)(pDVar4->_headers).
                               super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)src) / 0x38) <=
                uVar14) break;
            attrs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            attrs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            attrs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar3 = Data::checkSharedAttributesValues
                              (this_02,src,(Header *)(&(src->_map)._M_t._M_impl.field_0x0 + lVar15),
                               &attrs);
            if (bVar3) {
              header._map._M_t._M_impl._0_8_ =
                   &header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              header._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)
                   ((ulong)header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
                   0xffffffffffffff00);
              lVar10 = 0;
              for (uVar14 = 0;
                  uVar14 < (ulong)((long)attrs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)attrs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
                  uVar14 = uVar14 + 1) {
                std::operator+(&local_e8," ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((attrs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar10));
                std::__cxx11::string::append((string *)&header);
                std::__cxx11::string::~string((string *)&local_e8);
                lVar10 = lVar10 + 0x20;
              }
              pIVar7 = (InputExc *)__cxa_allocate_exception(0x48);
              psVar5 = Header::name_abi_cxx11_
                                 ((Header *)
                                  ((long)&(((this->_data->_headers).
                                            super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                          _M_impl + lVar15));
              std::operator+(&local_50,"Header name ",psVar5);
              std::operator+(&local_70,&local_50," has non-conforming shared attributes: ");
              std::operator+(&local_e8,&local_70,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &header);
              Iex_2_5::InputExc::InputExc(pIVar7,(string *)&local_e8);
              __cxa_throw(pIVar7,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
            }
            this_02 = (Data *)&attrs;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&attrs);
            uVar14 = uVar14 + 1;
            lVar15 = lVar15 + 0x38;
          }
        }
        lVar15 = 0;
        for (uVar14 = 0;
            uVar14 < (ulong)(((long)(pDVar4->_headers).
                                    super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pDVar4->_headers).
                                   super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x38);
            uVar14 = uVar14 + 1) {
          this_00 = (InputPartData *)operator_new(0x70);
          InputPartData::InputPartData
                    (this_00,&pDVar4->super_InputStreamMutex,
                     (Header *)
                     ((long)&(((pDVar4->_headers).
                               super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                     lVar15),(int)uVar14,pDVar4->numThreads,pDVar4->version);
          header._map._M_t._M_impl._0_8_ = this_00;
          std::vector<Imf_2_5::InputPartData*,std::allocator<Imf_2_5::InputPartData*>>::
          emplace_back<Imf_2_5::InputPartData*>
                    ((vector<Imf_2_5::InputPartData*,std::allocator<Imf_2_5::InputPartData*>> *)
                     &pDVar4->parts,(InputPartData **)&header);
          pDVar4 = this->_data;
          lVar15 = lVar15 + 0x38;
        }
        Data::readChunkOffsetTables(pDVar4,pDVar4->reconstructChunkOffsetTable);
        return;
      }
      bVar3 = Header::hasType((Header *)((long)&(pHVar13->_map)._M_t._M_impl + lVar15));
      if (!bVar3) break;
      if (((uVar2 >> 0xc & 1) == 0) && (pDVar4 = this->_data, (pDVar4->version & 0x800) == 0)) {
LAB_001c99b0:
        Header::setType((Header *)
                        ((long)&(((pDVar4->_headers).
                                  super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                        lVar15),(string *)type);
      }
      bVar3 = Header::hasName((Header *)
                              ((long)&(((this->_data->_headers).
                                        super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                      _M_impl + lVar15));
      if (!bVar3 && (uVar2 >> 0xc & 1) != 0) {
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar11 = "Every header in a multipart file should have a name";
        goto LAB_001c9be9;
      }
      psVar5 = Header::type_abi_cxx11_
                         ((Header *)
                          ((long)&(((this->_data->_headers).
                                    super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                          lVar15));
      bVar3 = isTiled(psVar5);
      Header::sanityCheck((Header *)
                          ((long)&(((this->_data->_headers).
                                    super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                          lVar15),bVar3,(bool)((byte)(uVar2 >> 0xc) & 1));
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x38;
    }
    if ((uVar2 >> 0xc & 1) == 0) {
      pDVar4 = this->_data;
      goto LAB_001c99b0;
    }
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar11 = "Every header in a multipart file should have a type";
LAB_001c9be9:
    Iex_2_5::ArgExc::ArgExc(this_01,pcVar11);
    puVar12 = &Iex_2_5::ArgExc::typeinfo;
    pcVar9 = Iex_2_5::ArgExc::~ArgExc;
  }
  __cxa_throw(this_01,puVar12,pcVar9);
}

Assistant:

void
MultiPartInputFile::initialize()
{
    readMagicNumberAndVersionField(*_data->is, _data->version);
    
    bool multipart = isMultiPart(_data->version);
    bool tiled = isTiled(_data->version);

    //
    // Multipart files don't have and shouldn't have the tiled bit set.
    //

    if (tiled && multipart)
        throw IEX_NAMESPACE::InputExc ("Multipart files cannot have the tiled bit set");

    
    int pos = 0;
    while (true)
    {
        Header header;
        header.readFrom(*_data->is, _data->version);

        //
        // If we read nothing then we stop reading.
        //

        if (header.readsNothing())
        {
            pos++;
            break;
        }

        _data->_headers.push_back(header);
        
        if(multipart == false)
          break;
    }

    //
    // Perform usual check on headers.
    //

    for (size_t i = 0; i < _data->_headers.size(); i++)
    {
        //
        // Silently invent a type if the file is a single part regular image.
        //

        if( _data->_headers[i].hasType() == false )
        {
            if(multipart)

                throw IEX_NAMESPACE::ArgExc ("Every header in a multipart file should have a type");
          
            _data->_headers[i].setType(tiled ? TILEDIMAGE : SCANLINEIMAGE);
        }
        else
        {
            
            //
            // Silently fix the header type if it's wrong
            // (happens when a regular Image file written by EXR_2.0 is rewritten by an older library,
            //  so doesn't effect deep image types)
            //

            if(!multipart && !isNonImage(_data->version))
            {
                _data->_headers[i].setType(tiled ? TILEDIMAGE : SCANLINEIMAGE);
            }
        }
         

        
        if( _data->_headers[i].hasName() == false )
        {
            if(multipart)
                throw IEX_NAMESPACE::ArgExc ("Every header in a multipart file should have a name");
        }
        
        if (isTiled(_data->_headers[i].type()))
            _data->_headers[i].sanityCheck(true, multipart);
        else
            _data->_headers[i].sanityCheck(false, multipart);
    }

    //
    // Check name uniqueness.
    //

    if (multipart)
    {
        set<string> names;
        for (size_t i = 0; i < _data->_headers.size(); i++)
        {
        
            if (names.find(_data->_headers[i].name()) != names.end())
            {
                throw IEX_NAMESPACE::InputExc ("Header name " + _data->_headers[i].name() +
                                   " is not a unique name.");
            }
            names.insert(_data->_headers[i].name());
        }
    }
    
    //
    // Check shared attributes compliance.
    //

    if (multipart && strictSharedAttribute)
    {
        for (size_t i = 1; i < _data->_headers.size(); i++)
        {
            vector <string> attrs;
            if (_data->checkSharedAttributesValues (_data->_headers[0], _data->_headers[i], attrs))
            {
                string attrNames;
                for (size_t j=0; j<attrs.size(); j++)
                    attrNames += " " + attrs[j];
                throw IEX_NAMESPACE::InputExc ("Header name " + _data->_headers[i].name() +
                                     " has non-conforming shared attributes: "+
                                     attrNames);
            }
        }
    }

    //
    // Create InputParts and read chunk offset tables.
    //
        
    for (size_t i = 0; i < _data->_headers.size(); i++)
        _data->parts.push_back(
                new InputPartData(_data, _data->_headers[i], i, _data->numThreads, _data->version));

    _data->readChunkOffsetTables(_data->reconstructChunkOffsetTable);
}